

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.c
# Opt level: O2

void parse_option(state_t *state,char *parameters)

{
  int iVar1;
  int iVar2;
  
  iVar1 = strncmp(parameters,"Hash value ",0xb);
  if (iVar1 != 0) {
    return;
  }
  iVar2 = parse_int(parameters + 0xb);
  iVar1 = 0x400;
  if (iVar2 < 0x400) {
    iVar1 = iVar2;
  }
  iVar2 = 1;
  if (1 < iVar1) {
    iVar2 = iVar1;
  }
  ENGINE_resize_hashtable(state->engine,iVar2);
  return;
}

Assistant:

void parse_option(state_t *state, const char *parameters)
{
    if(strncmp(parameters, "Hash value ", 11) == 0) {
        parameters += 11;
        int size_mb = parse_int(parameters);
        if(size_mb < 1) size_mb = 1;
        else if(size_mb > 1024) size_mb = 1024;
        ENGINE_resize_hashtable(state->engine, size_mb);
    }
}